

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

mat<2UL,_2UL> * __thiscall
mat<3UL,_3UL>::get_minor
          (mat<2UL,_2UL> *__return_storage_ptr__,mat<3UL,_3UL> *this,size_t row,size_t col)

{
  double dVar1;
  ulong uVar2;
  vec<2UL,_double> *this_00;
  double *pdVar3;
  ulong i;
  long lVar4;
  ulong idx;
  ulong uVar5;
  
  __return_storage_ptr__->rows[1].x = 0.0;
  __return_storage_ptr__->rows[1].y = 0.0;
  __return_storage_ptr__->rows[0].x = 0.0;
  __return_storage_ptr__->rows[0].y = 0.0;
  uVar5 = 2;
  while (idx = uVar5 - 1, uVar5 != 0) {
    uVar2 = uVar5;
    if (idx < row) {
      uVar2 = idx;
    }
    i = 2;
    for (lVar4 = -2; uVar5 = idx, lVar4 != 0; lVar4 = lVar4 + 1) {
      uVar5 = i - 1;
      if (uVar5 < col) {
        i = uVar5;
      }
      dVar1 = vec<3UL,_double>::operator[](this->rows + uVar2,i);
      this_00 = mat<2UL,_2UL>::operator[](__return_storage_ptr__,idx);
      pdVar3 = vec<2UL,_double>::operator[](this_00,uVar5);
      *pdVar3 = dVar1;
      i = uVar5;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

mat<nrows - 1, ncols - 1> get_minor(const size_t row, const size_t col) const
    {
        mat<nrows - 1, ncols - 1> ret;
        for (size_t i = nrows - 1; i--;)
            for (size_t j = ncols - 1; j--;
                 ret[i][j] = rows[i < row ? i : i + 1][j < col ? j : j + 1])
                ;
        return ret;
    }